

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

int __thiscall QObject::receivers(QObject *this,char *signal)

{
  QBasicMutex *this_00;
  __pointer_type copy;
  QObjectPrivate *this_01;
  __pointer_type pCVar1;
  bool bVar2;
  uint signalIndex;
  int iVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QByteArray local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (signal == (char *)0x0) {
    iVar3 = 0;
    goto LAB_002b6897;
  }
  this_01 = (QObjectPrivate *)(this->d_ptr).d;
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QMetaObject::normalizedSignature(&local_48,signal);
  pcVar6 = local_48.d.ptr;
  if (local_48.d.ptr == (char *)0x0) {
    pcVar6 = "";
  }
  iVar3 = 0;
  signalIndex = QObjectPrivate::signalIndex(this_01,pcVar6 + 1,(QMetaObject **)0x0);
  if ((-1 < (int)signalIndex) &&
     (bVar2 = QObjectPrivate::isSignalConnected(this_01,signalIndex,true), bVar2)) {
    iVar3 = 0;
    if ((((this_01->super_QObjectData).field_0x30 & 8) == 0) &&
       (QAbstractDeclarativeData::receivers !=
        (_func_int_QAbstractDeclarativeData_ptr_QObject_ptr_int *)0x0 &&
        (this_01->field_3).currentChildBeingDeleted != (QObject *)0x0)) {
      iVar3 = (*QAbstractDeclarativeData::receivers)
                        ((QAbstractDeclarativeData *)(this_01->field_3).currentChildBeingDeleted,
                         this,signalIndex);
    }
    uVar7 = (ulong)((uint)this & 0xfffffff8) % 0x418;
    this_00 = (QBasicMutex *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar7);
    if (*(long *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar7) == 0) {
      LOCK();
      bVar2 = (this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar2) {
        (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (!bVar2) goto LAB_002b680d;
    }
    else {
LAB_002b680d:
      QBasicMutex::lockInternal(this_00);
    }
    pCVar1 = (this_01->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>.
             _q_value._M_b._M_p;
    if (pCVar1 != (__pointer_type)0x0) {
      if (((__pointer_type)
          (pCVar1->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value.
          _M_b)._M_p == (__pointer_type)0x0) {
        iVar5 = -1;
      }
      else {
        iVar5 = *(int *)((long)(pCVar1->signalVector).
                               super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b
                        + 8);
      }
      if ((int)signalIndex < iVar5) {
        for (lVar4 = *(long *)((long)(pCVar1->signalVector).
                                     super_QBasicAtomicPointer<QObjectPrivate::SignalVector>.
                                     _q_value._M_b + 0x20 + (ulong)signalIndex * 0x10); lVar4 != 0;
            lVar4 = *(long *)(lVar4 + 0x10)) {
          iVar3 = (iVar3 + 1) - (uint)(*(long *)(lVar4 + 0x28) == 0);
        }
      }
    }
    LOCK();
    copy = (this_00->d_ptr)._q_value._M_b._M_p;
    (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (copy != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex(this_00,copy);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_002b6897:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int QObject::receivers(const char *signal) const
{
    Q_D(const QObject);
    int receivers = 0;
    if (signal) {
        QByteArray signal_name = QMetaObject::normalizedSignature(signal);
        signal = signal_name;
#ifndef QT_NO_DEBUG
        if (!check_signal_macro(this, signal, "receivers", "bind"))
            return 0;
#endif
        signal++; // skip code
        int signal_index = d->signalIndex(signal);
        if (signal_index < 0) {
#ifndef QT_NO_DEBUG
            err_method_notfound(this, signal - 1, "receivers");
#endif
            return 0;
        }

        if (!d->isSignalConnected(signal_index))
            return receivers;

        if (!d->isDeletingChildren && d->declarativeData && QAbstractDeclarativeData::receivers) {
            receivers += QAbstractDeclarativeData::receivers(d->declarativeData, this,
                                                             signal_index);
        }

        QMutexLocker locker(signalSlotLock(this));
        QObjectPrivate::ConnectionData *cd = d->connections.loadRelaxed();
        if (cd && signal_index < cd->signalVectorCount()) {
            const QObjectPrivate::Connection *c = cd->signalVector.loadRelaxed()->at(signal_index).first.loadRelaxed();
            while (c) {
                receivers += c->receiver.loadRelaxed() ? 1 : 0;
                c = c->nextConnectionList.loadRelaxed();
            }
        }
    }
    return receivers;
}